

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O0

void __thiscall
FMultiPatchTexture::FMultiPatchTexture(FMultiPatchTexture *this,FScanner *sc,int usetype)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  TexPart *pTVar8;
  TexPart *__src;
  ulong *puVar9;
  TexInit *pTVar10;
  char *pcVar11;
  ulong uVar12;
  TexInit *local_230;
  TexPart *local_1e8;
  char *local_188;
  int local_16c;
  undefined1 local_168 [4];
  int i;
  undefined1 local_158 [8];
  TexInit init_2;
  TexPart part_2;
  undefined1 local_100 [8];
  TexInit init_1;
  TexPart part_1;
  undefined1 local_a8 [8];
  TexInit init;
  TexPart part;
  char *textureName;
  undefined1 local_50 [7];
  bool bSilent;
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> inits;
  undefined1 local_30 [8];
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> parts;
  int usetype_local;
  FScanner *sc_local;
  FMultiPatchTexture *this_local;
  
  parts.Count = usetype;
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FMultiPatchTexture_00a083b0;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->Parts = (TexPart *)0x0;
  this->field_0x80 = this->field_0x80 & 0xfe;
  this->field_0x80 = this->field_0x80 & 0xfd;
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::TArray
            ((TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> *)local_30);
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::TArray
            ((TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> *)local_50);
  textureName._7_1_ = false;
  (this->super_FTexture).field_0x32 = (this->super_FTexture).field_0x32 | 2;
  FScanner::SetCMode(sc,true);
  FScanner::MustGetString(sc);
  part.Alpha = 0;
  part._36_4_ = 0;
  bVar4 = FScanner::Compare(sc,"optional");
  if (bVar4) {
    FScanner::MustGetString(sc);
    bVar4 = FScanner::Compare(sc,",");
    if (bVar4) {
      FScanner::UnGet(sc);
      part._32_8_ = anon_var_dwarf_1f4c8a;
    }
    textureName._7_1_ = !bVar4;
  }
  if (part._32_8_ == 0) {
    local_188 = sc->String;
  }
  else {
    local_188 = (char *)part._32_8_;
  }
  FString::operator=(&(this->super_FTexture).Name,local_188);
  FString::ToUpper(&(this->super_FTexture).Name);
  FScanner::MustGetStringName(sc,",");
  FScanner::MustGetNumber(sc);
  (this->super_FTexture).Width = (WORD)sc->Number;
  FScanner::MustGetStringName(sc,",");
  FScanner::MustGetNumber(sc);
  (this->super_FTexture).Height = (WORD)sc->Number;
  (this->super_FTexture).UseType = (BYTE)parts.Count;
  bVar4 = FScanner::CheckString(sc,"{");
  if (bVar4) {
    while (bVar4 = FScanner::CheckString(sc,"}"), ((bVar4 ^ 0xffU) & 1) != 0) {
      FScanner::MustGetString(sc);
      bVar4 = FScanner::Compare(sc,"XScale");
      if (bVar4) {
        FScanner::MustGetFloat(sc);
        (this->super_FTexture).Scale.X = sc->Float;
        dVar1 = (this->super_FTexture).Scale.X;
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          pcVar11 = FString::GetChars(&(this->super_FTexture).Name);
          FScanner::ScriptError(sc,"Texture %s is defined with null x-scale\n",pcVar11);
        }
      }
      else {
        bVar4 = FScanner::Compare(sc,"YScale");
        if (bVar4) {
          FScanner::MustGetFloat(sc);
          (this->super_FTexture).Scale.Y = sc->Float;
          dVar1 = (this->super_FTexture).Scale.Y;
          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
            pcVar11 = FString::GetChars(&(this->super_FTexture).Name);
            FScanner::ScriptError(sc,"Texture %s is defined with null y-scale\n",pcVar11);
          }
        }
        else {
          bVar4 = FScanner::Compare(sc,"WorldPanning");
          if (bVar4) {
            *(ushort *)&(this->super_FTexture).field_0x31 =
                 *(ushort *)&(this->super_FTexture).field_0x31 & 0xfffb | 4;
          }
          else {
            bVar4 = FScanner::Compare(sc,"NullTexture");
            if (bVar4) {
              (this->super_FTexture).UseType = '\r';
            }
            else {
              bVar4 = FScanner::Compare(sc,"NoDecals");
              if (bVar4) {
                *(ushort *)&(this->super_FTexture).field_0x31 =
                     *(ushort *)&(this->super_FTexture).field_0x31 & 0xfffe | 1;
              }
              else {
                bVar4 = FScanner::Compare(sc,"Patch");
                if (bVar4) {
                  TexPart::TexPart((TexPart *)&init.sc.ScriptLine);
                  TexInit::TexInit((TexInit *)local_a8);
                  ParsePatch(this,sc,(TexPart *)&init.sc.ScriptLine,(TexInit *)local_a8);
                  bVar4 = FString::IsNotEmpty((FString *)local_a8);
                  if (bVar4) {
                    TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Push
                              ((TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> *)
                               local_30,(TexPart *)&init.sc.ScriptLine);
                    init.TexName.Chars._0_4_ = 4;
                    init.TexName.Chars._4_1_ = textureName._7_1_;
                    init.TexName.Chars._5_1_ = 1;
                    FScriptPosition::FScriptPosition((FScriptPosition *)&part_1.Alpha,sc);
                    FScriptPosition::operator=
                              ((FScriptPosition *)&init.UseType,(FScriptPosition *)&part_1.Alpha);
                    FScriptPosition::~FScriptPosition((FScriptPosition *)&part_1.Alpha);
                    TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                              ((TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> *)
                               local_50,(TexInit *)local_a8);
                  }
                  TexInit::~TexInit((TexInit *)local_a8);
                }
                else {
                  bVar4 = FScanner::Compare(sc,"Sprite");
                  if (bVar4) {
                    TexPart::TexPart((TexPart *)&init_1.sc.ScriptLine);
                    TexInit::TexInit((TexInit *)local_100);
                    ParsePatch(this,sc,(TexPart *)&init_1.sc.ScriptLine,(TexInit *)local_100);
                    bVar4 = FString::IsNotEmpty((FString *)local_100);
                    if (bVar4) {
                      TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Push
                                ((TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> *
                                 )local_30,(TexPart *)&init_1.sc.ScriptLine);
                      init_1.TexName.Chars._0_4_ = 3;
                      init_1.TexName.Chars._4_1_ = textureName._7_1_;
                      init_1.TexName.Chars._5_1_ = 1;
                      FScriptPosition::FScriptPosition((FScriptPosition *)&part_2.Alpha,sc);
                      FScriptPosition::operator=
                                ((FScriptPosition *)&init_1.UseType,(FScriptPosition *)&part_2.Alpha
                                );
                      FScriptPosition::~FScriptPosition((FScriptPosition *)&part_2.Alpha);
                      TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                                ((TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> *
                                 )local_50,(TexInit *)local_100);
                    }
                    part_1.Blend.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
                    part_1._20_4_ = 0;
                    part_1.OriginX = 0;
                    part_1.OriginY = 0;
                    part_1.Rotate = '\0';
                    part_1.op = '\0';
                    part_1._6_2_ = 0;
                    TexInit::~TexInit((TexInit *)local_100);
                  }
                  else {
                    bVar4 = FScanner::Compare(sc,"Graphic");
                    if (bVar4) {
                      TexPart::TexPart((TexPart *)&init_2.sc.ScriptLine);
                      TexInit::TexInit((TexInit *)local_158);
                      ParsePatch(this,sc,(TexPart *)&init_2.sc.ScriptLine,(TexInit *)local_158);
                      bVar4 = FString::IsNotEmpty((FString *)local_158);
                      if (bVar4) {
                        TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Push
                                  ((TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>
                                    *)local_30,(TexPart *)&init_2.sc.ScriptLine);
                        init_2.TexName.Chars._0_4_ = 8;
                        init_2.TexName.Chars._4_1_ = textureName._7_1_;
                        init_2.TexName.Chars._5_1_ = 1;
                        FScriptPosition::FScriptPosition((FScriptPosition *)local_168,sc);
                        FScriptPosition::operator=
                                  ((FScriptPosition *)&init_2.UseType,(FScriptPosition *)local_168);
                        FScriptPosition::~FScriptPosition((FScriptPosition *)local_168);
                        TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                                  ((TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>
                                    *)local_50,(TexInit *)local_158);
                      }
                      part_2.Blend.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
                      part_2._20_4_ = 0;
                      part_2.OriginX = 0;
                      part_2.OriginY = 0;
                      part_2.Rotate = '\0';
                      part_2.op = '\0';
                      part_2._6_2_ = 0;
                      TexInit::~TexInit((TexInit *)local_158);
                    }
                    else {
                      bVar4 = FScanner::Compare(sc,"Offset");
                      if (bVar4) {
                        FScanner::MustGetNumber(sc);
                        (this->super_FTexture).LeftOffset = (SWORD)sc->Number;
                        FScanner::MustGetStringName(sc,",");
                        FScanner::MustGetNumber(sc);
                        (this->super_FTexture).TopOffset = (SWORD)sc->Number;
                      }
                      else {
                        FScanner::ScriptError(sc,"Unknown texture property \'%s\'",sc->String);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar5 = TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Size
                      ((TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> *)local_30)
    ;
    this->NumParts = uVar5;
    uVar6 = (ulong)this->NumParts;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    uVar7 = SUB168(auVar2 * ZEXT816(0x28),0);
    if (SUB168(auVar2 * ZEXT816(0x28),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pTVar8 = (TexPart *)operator_new__(uVar7);
    if (uVar6 != 0) {
      local_1e8 = pTVar8;
      do {
        TexPart::TexPart(local_1e8);
        local_1e8 = local_1e8 + 1;
      } while (local_1e8 != pTVar8 + uVar6);
    }
    this->Parts = pTVar8;
    pTVar8 = this->Parts;
    __src = TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::operator[]
                      ((TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> *)local_30,
                       0);
    memcpy(pTVar8,__src,(long)this->NumParts * 0x28);
    uVar6 = (ulong)this->NumParts;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar6;
    uVar7 = SUB168(auVar3 * ZEXT816(0x20),0);
    uVar12 = uVar7 + 8;
    if (0xfffffffffffffff7 < uVar7) {
      uVar12 = 0xffffffffffffffff;
    }
    if (SUB168(auVar3 * ZEXT816(0x20),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    puVar9 = (ulong *)operator_new__(uVar12);
    *puVar9 = uVar6;
    pTVar10 = (TexInit *)(puVar9 + 1);
    if (uVar6 != 0) {
      local_230 = pTVar10;
      do {
        TexInit::TexInit(local_230);
        local_230 = local_230 + 1;
      } while (local_230 != pTVar10 + uVar6);
    }
    this->Inits = pTVar10;
    for (local_16c = 0; local_16c < this->NumParts; local_16c = local_16c + 1) {
      pTVar10 = TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::operator[]
                          ((TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> *)
                           local_50,(long)local_16c);
      TexInit::operator=(this->Inits + local_16c,pTVar10);
    }
  }
  if (((this->super_FTexture).Width == 0) || ((this->super_FTexture).Height == 0)) {
    (this->super_FTexture).UseType = '\r';
    pcVar11 = FString::GetChars(&(this->super_FTexture).Name);
    Printf("Texture %s has invalid dimensions (%d, %d)\n",pcVar11,
           (ulong)(this->super_FTexture).Width,(ulong)(this->super_FTexture).Height);
    (this->super_FTexture).Height = 1;
    (this->super_FTexture).Width = 1;
  }
  FTexture::CalcBitSize(&this->super_FTexture);
  FScanner::SetCMode(sc,false);
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::~TArray
            ((TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> *)local_50);
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::~TArray
            ((TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> *)local_30);
  return;
}

Assistant:

FMultiPatchTexture::FMultiPatchTexture (FScanner &sc, int usetype)
: Pixels (0), Spans(0), Parts(0), bRedirect(false), bTranslucentPatches(false)
{
	TArray<TexPart> parts;
	TArray<TexInit> inits;
	bool bSilent = false;

	bMultiPatch = true;
	sc.SetCMode(true);
	sc.MustGetString();
	const char* textureName = NULL;
	if (sc.Compare("optional"))
	{
		bSilent = true;
		sc.MustGetString();
		if (sc.Compare(","))
		{
			// this is not right. Apparently a texture named 'optional' is being defined right now...
			sc.UnGet();
			textureName = "optional";
			bSilent = false;
		}
	}
	Name = !textureName ? sc.String : textureName;
	Name.ToUpper();
	sc.MustGetStringName(",");
	sc.MustGetNumber();
	Width = sc.Number;
	sc.MustGetStringName(",");
	sc.MustGetNumber();
	Height = sc.Number;
	UseType = usetype;
	
	if (sc.CheckString("{"))
	{
		while (!sc.CheckString("}"))
		{
			sc.MustGetString();
			if (sc.Compare("XScale"))
			{
				sc.MustGetFloat();
				Scale.X = sc.Float;
				if (Scale.X == 0) sc.ScriptError("Texture %s is defined with null x-scale\n", Name.GetChars());
			}
			else if (sc.Compare("YScale"))
			{
				sc.MustGetFloat();
				Scale.Y = sc.Float;
				if (Scale.Y == 0) sc.ScriptError("Texture %s is defined with null y-scale\n", Name.GetChars());
			}
			else if (sc.Compare("WorldPanning"))
			{
				bWorldPanning = true;
			}
			else if (sc.Compare("NullTexture"))
			{
				UseType = FTexture::TEX_Null;
			}
			else if (sc.Compare("NoDecals"))
			{
				bNoDecals = true;
			}
			else if (sc.Compare("Patch"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_WallPatch;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Sprite"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_Sprite;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Graphic"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_MiscPatch;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Offset"))
			{
				sc.MustGetNumber();
				LeftOffset = sc.Number;
				sc.MustGetStringName(",");
				sc.MustGetNumber();
				TopOffset = sc.Number;
			}
			else
			{
				sc.ScriptError("Unknown texture property '%s'", sc.String);
			}
		}

		NumParts = parts.Size();
		Parts = new TexPart[NumParts];
		memcpy(Parts, &parts[0], NumParts * sizeof(*Parts));
		Inits = new TexInit[NumParts];
		for (int i = 0; i < NumParts; i++)
		{
			Inits[i] = inits[i];
		}
	}
	
	if (Width <= 0 || Height <= 0)
	{
		UseType = FTexture::TEX_Null;
		Printf("Texture %s has invalid dimensions (%d, %d)\n", Name.GetChars(), Width, Height);
		Width = Height = 1;
	}
	CalcBitSize ();

	
	sc.SetCMode(false);
}